

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphviewer.cpp
# Opt level: O0

bool __thiscall GraphViewer::removeEdge(GraphViewer *this,int id)

{
  Connection *this_00;
  bool bVar1;
  string local_140 [55];
  allocator local_109;
  string local_108 [8];
  string str;
  char local_e8 [8];
  char buff [200];
  int id_local;
  GraphViewer *this_local;
  
  sprintf(local_e8,"removeEdge %d\n",(ulong)(uint)id);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,local_e8,&local_109);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  this_00 = this->con;
  std::__cxx11::string::string(local_140,local_108);
  bVar1 = Connection::sendMsg(this_00,(string *)local_140);
  std::__cxx11::string::~string(local_140);
  std::__cxx11::string::~string(local_108);
  return bVar1;
}

Assistant:

bool GraphViewer::removeEdge(int id) {
	char buff[200];
	sprintf(buff, "removeEdge %d\n", id);
	string str(buff);
	return con->sendMsg(str);
}